

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void readWriteExample(ostream *out,AdsDevice *route)

{
  _Head_base<0UL,_unsigned_int_*,_false> route_00;
  byte bVar1;
  ostream *poVar2;
  uchar local_e3 [2];
  allocator local_e1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  AdsVariable<unsigned_char> validation;
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  AdsVariable<unsigned_char> simpleVar;
  AdsDevice *route_local;
  ostream *out_local;
  
  simpleVar.m_Handle._M_t.super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)route;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"MAIN.byByte[0]",&local_71);
  AdsVariable<unsigned_char>::AdsVariable
            ((AdsVariable<unsigned_char> *)local_50,route,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  route_00 = simpleVar.m_Handle._M_t.
             super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
             super__Head_base<0UL,_unsigned_int_*,_false>;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"MAIN.byByte[0]",&local_e1);
  AdsVariable<unsigned_char>::AdsVariable
            ((AdsVariable<unsigned_char> *)local_c0,(AdsDevice *)route_00._M_head_impl,
             (string *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  poVar2 = std::operator<<(out,"readWriteExample");
  std::operator<<(poVar2,"():\n");
  local_e3[1] = 0xa5;
  AdsVariable<unsigned_char>::operator=((AdsVariable<unsigned_char> *)local_50,local_e3 + 1);
  poVar2 = std::operator<<(out,"Wrote ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xa5);
  poVar2 = std::operator<<(poVar2," to MAIN.byByte and read ");
  bVar1 = AdsVariable::operator_cast_to_unsigned_char((AdsVariable *)local_c0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)bVar1);
  std::operator<<(poVar2," back\n");
  local_e3[0] = 'Z';
  AdsVariable<unsigned_char>::operator=((AdsVariable<unsigned_char> *)local_50,local_e3);
  poVar2 = std::operator<<(out,"Wrote ");
  bVar1 = AdsVariable::operator_cast_to_unsigned_char((AdsVariable *)local_50);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)bVar1);
  poVar2 = std::operator<<(poVar2," to MAIN.byByte and read ");
  bVar1 = AdsVariable::operator_cast_to_unsigned_char((AdsVariable *)local_c0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)bVar1);
  std::operator<<(poVar2," back\n");
  AdsVariable<unsigned_char>::~AdsVariable((AdsVariable<unsigned_char> *)local_c0);
  AdsVariable<unsigned_char>::~AdsVariable((AdsVariable<unsigned_char> *)local_50);
  return;
}

Assistant:

static void readWriteExample(std::ostream& out, const AdsDevice& route)
{
    AdsVariable<uint8_t> simpleVar {route, "MAIN.byByte[0]"};
    AdsVariable<uint8_t> validation {route, "MAIN.byByte[0]"};

    out << __FUNCTION__ << "():\n";
    simpleVar = 0xA5;
    out << "Wrote " << 0xA5 << " to MAIN.byByte and read " << (uint32_t)validation << " back\n";
    simpleVar = 0x5A;
    out << "Wrote " << (uint32_t)simpleVar << " to MAIN.byByte and read " << (uint32_t)validation << " back\n";
}